

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtable.cpp
# Opt level: O2

void __thiscall
FStringTable::LoadLanguage(FStringTable *this,int lumpnum,DWORD code,bool exactMatch,int passnum)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  size_t len;
  StringEntry *pSVar11;
  undefined7 in_register_00000009;
  StringEntry *pSVar12;
  long lVar13;
  FString FVar14;
  uint uVar15;
  FString strName;
  FString strText;
  FScanner sc;
  
  uVar15 = 0xff0000;
  if ((int)CONCAT71(in_register_00000009,exactMatch) != 0) {
    uVar15 = 0;
  }
  FScanner::FScanner(&sc,lumpnum);
  FScanner::SetCMode(&sc,true);
  bVar6 = true;
  uVar7 = 0;
LAB_00508628:
  do {
    bVar4 = FScanner::GetString(&sc);
    if (!bVar4) {
LAB_005089f1:
      FScanner::~FScanner(&sc);
      return;
    }
    bVar4 = FScanner::Compare(&sc,"[");
    if (!bVar4) {
      if (uVar7 == 0) {
        bVar4 = FScanner::isText(&sc);
        if (!bVar4) {
          if (LoadLanguage(int,unsigned_int,bool,int)::errordone == '\0') {
            Printf("Skipping binary \'LANGUAGE\' lump.\n");
          }
          LoadLanguage(int,unsigned_int,bool,int)::errordone = '\x01';
          goto LAB_005089f1;
        }
        FScanner::ScriptError(&sc,"Found a string without a language specified.");
      }
      bVar5 = FScanner::Compare(&sc,"$");
      bVar4 = bVar6;
      if (bVar5) {
        FScanner::MustGetStringName(&sc,"ifgame");
        FScanner::MustGetStringName(&sc,"(");
        FScanner::MustGetString(&sc);
        bVar4 = FScanner::Compare(&sc,GameNames[gameinfo.gametype]);
        FScanner::MustGetStringName(&sc,")");
        FScanner::MustGetString(&sc);
        bVar4 = (bool)(!bVar4 | bVar6);
      }
      if (bVar4) {
        FScanner::MustGetStringName(&sc,"=");
        FScanner::MustGetString(&sc);
        do {
          FScanner::MustGetString(&sc);
          bVar4 = FScanner::Compare(&sc,";");
        } while (!bVar4);
      }
      else {
        FString::FString(&strName,sc.String);
        FScanner::MustGetStringName(&sc,"=");
        FScanner::MustGetString(&sc);
        pcVar3 = sc.String;
        len = ProcessEscapes(sc.String);
        FString::FString(&strText,pcVar3,len);
        FScanner::MustGetString(&sc);
        while (bVar6 = FScanner::Compare(&sc,";"), !bVar6) {
          ProcessEscapes(sc.String);
          FString::operator+=(&strText,sc.String);
          FScanner::MustGetString(&sc);
        }
        uVar9 = MakeKey(strName.Chars);
        FVar14 = strName;
        pSVar11 = (StringEntry *)(this->Buckets + (uVar9 & 0x7f));
        do {
          pSVar12 = pSVar11;
          pSVar11 = pSVar12->Next;
          if (pSVar11 == (StringEntry *)0x0) goto LAB_0050893f;
          iVar10 = strcasecmp(pSVar11->Name,FVar14.Chars);
        } while (iVar10 < 0);
        if (iVar10 == 0) {
          if (passnum <= (int)(uint)pSVar11->PassNum) {
            pSVar12->Next = pSVar11->Next;
            M_Free(pSVar11);
            FVar14 = strName;
            goto LAB_0050893f;
          }
        }
        else {
LAB_0050893f:
          pSVar11 = (StringEntry *)
                    M_Malloc_Dbg((ulong)*(uint *)(strText.Chars + -0xc) +
                                 (ulong)*(uint *)(FVar14.Chars + -0xc) + 0x1a,
                                 "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/stringtable.cpp"
                                 ,0x11e);
          FVar14 = strText;
          pSVar11->Next = pSVar12->Next;
          pSVar12->Next = pSVar11;
          strcpy(&pSVar11->field_0x11,strText.Chars);
          uVar9 = *(uint *)(FVar14.Chars + -0xc);
          pSVar11->Name = &pSVar11->field_0x12 + uVar9;
          strcpy(&pSVar11->field_0x12 + uVar9,strName.Chars);
          pSVar11->PassNum = (BYTE)passnum;
        }
        FString::~FString(&strText);
        FString::~FString(&strName);
        bVar6 = false;
      }
      goto LAB_00508628;
    }
    FScanner::MustGetString(&sc);
    bVar2 = 1;
    bVar6 = false;
    bVar1 = 0;
    do {
      pcVar3 = sc.String;
      lVar13 = (long)sc.StringLen;
      if (sc.StringLen - 4U < 0xfffffffe) {
        if (sc.StringLen == 7) {
          iVar10 = strcasecmp(sc.String,"default");
          if (iVar10 != 0) goto LAB_005087c3;
          uVar7 = 0x2a2a;
          goto LAB_005087da;
        }
        if (sc.StringLen != 1) {
LAB_005087c3:
          FScanner::ScriptError
                    (&sc,
                     "The language code must be 2 or 3 characters long.\n\'%s\' is %lu characters long."
                     ,pcVar3,lVar13);
          goto LAB_005087da;
        }
        if (*sc.String == '*') {
          uVar7 = 0x2a;
          goto LAB_005087da;
        }
        if (*sc.String != '~') goto LAB_005087c3;
        FScanner::MustGetString(&sc);
        bVar6 = true;
      }
      else {
        uVar7 = tolower((int)*sc.String);
        iVar10 = tolower((int)pcVar3[1]);
        iVar8 = tolower((int)pcVar3[2]);
        uVar7 = iVar8 << 0x10 | iVar10 << 8 | uVar7;
LAB_005087da:
        bVar4 = (uVar7 | uVar15) == (code | uVar15);
        if (bVar4) {
          bVar2 = bVar6 & bVar2;
        }
        bVar4 = (bool)(bVar4 & bVar6);
        bVar5 = false;
        if (!bVar4) {
          bVar5 = bVar6;
        }
        FScanner::MustGetString(&sc);
        bVar1 = bVar1 | bVar4;
        bVar6 = bVar5;
      }
      bVar4 = FScanner::Compare(&sc,"]");
    } while (!bVar4);
    if (bVar6) {
      FScanner::ScriptError(&sc,"You must specify a language after ~");
    }
    bVar6 = (bool)(bVar2 | bVar1);
  } while( true );
}

Assistant:

void FStringTable::LoadLanguage (int lumpnum, DWORD code, bool exactMatch, int passnum)
{
	static bool errordone = false;
	const DWORD orMask = exactMatch ? 0 : MAKE_ID(0,0,0xff,0);
	DWORD inCode = 0;
	StringEntry *entry, **pentry;
	DWORD bucket;
	int cmpval;
	bool skip = true;

	code |= orMask;

	FScanner sc(lumpnum);
	sc.SetCMode (true);
	while (sc.GetString ())
	{
		if (sc.Compare ("["))
		{ // Process language identifiers
			bool donot = false;
			bool forceskip = false;
			skip = true;
			sc.MustGetString ();
			do
			{
				size_t len = sc.StringLen;
				if (len != 2 && len != 3)
				{
					if (len == 1 && sc.String[0] == '~')
					{
						donot = true;
						sc.MustGetString ();
						continue;
					}
					if (len == 1 && sc.String[0] == '*')
					{
						inCode = MAKE_ID('*',0,0,0);
					}
					else if (len == 7 && stricmp (sc.String, "default") == 0)
					{
						inCode = MAKE_ID('*','*',0,0);
					}
					else
					{
						sc.ScriptError ("The language code must be 2 or 3 characters long.\n'%s' is %lu characters long.",
							sc.String, len);
					}
				}
				else
				{
					inCode = MAKE_ID(tolower(sc.String[0]), tolower(sc.String[1]), tolower(sc.String[2]), 0);
				}
				if ((inCode | orMask) == code)
				{
					if (donot)
					{
						forceskip = true;
						donot = false;
					}
					else
					{
						skip = false;
					}
				}
				sc.MustGetString ();
			} while (!sc.Compare ("]"));
			if (donot)
			{
				sc.ScriptError ("You must specify a language after ~");
			}
			skip |= forceskip;
		}
		else
		{ // Process string definitions.
			if (inCode == 0)
			{
				// LANGUAGE lump is bad. We need to check if this is an old binary
				// lump and if so just skip it to allow old WADs to run which contain
				// such a lump.
				if (!sc.isText())
				{
					if (!errordone) Printf("Skipping binary 'LANGUAGE' lump.\n"); 
					errordone = true;
					return;
				}
				sc.ScriptError ("Found a string without a language specified.");
			}

			bool savedskip = skip;
			if (sc.Compare("$"))
			{
				sc.MustGetStringName("ifgame");
				sc.MustGetStringName("(");
				sc.MustGetString();
				skip |= !sc.Compare(GameTypeName());
				sc.MustGetStringName(")");
				sc.MustGetString();

			}

			if (skip)
			{ // We're not interested in this language, so skip the string.
				sc.MustGetStringName ("=");
				sc.MustGetString ();
				do
				{
					sc.MustGetString ();
				} 
				while (!sc.Compare (";"));
				skip = savedskip;
				continue;
			}

			FString strName (sc.String);
			sc.MustGetStringName ("=");
			sc.MustGetString ();
			FString strText (sc.String, ProcessEscapes (sc.String));
			sc.MustGetString ();
			while (!sc.Compare (";"))
			{
				ProcessEscapes (sc.String);
				strText += sc.String;
				sc.MustGetString ();
			}

			// Does this string exist? If so, should we overwrite it?
			bucket = MakeKey (strName.GetChars()) & (HASH_SIZE-1);
			pentry = &Buckets[bucket];
			entry = *pentry;
			cmpval = 1;
			while (entry != NULL)
			{
				cmpval = stricmp (entry->Name, strName.GetChars());
				if (cmpval >= 0)
					break;
				pentry = &entry->Next;
				entry = *pentry;
			}
			if (cmpval == 0 && entry->PassNum >= passnum)
			{
				*pentry = entry->Next;
				M_Free (entry);
				entry = NULL;
			}
			if (entry == NULL || cmpval > 0)
			{
				entry = (StringEntry *)M_Malloc (sizeof(*entry) + strText.Len() + strName.Len() + 2);
				entry->Next = *pentry;
				*pentry = entry;
				strcpy (entry->String, strText.GetChars());
				strcpy (entry->Name = entry->String + strText.Len() + 1, strName.GetChars());
				entry->PassNum = passnum;
			}
		}
	}
}